

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void add_damage(xchar x,xchar y,long cost)

{
  char rmno;
  damage *pdVar1;
  level *plVar2;
  char *pcVar3;
  monst *pmVar4;
  damage *pdVar5;
  int iVar6;
  undefined7 in_register_00000031;
  int iVar7;
  undefined7 in_register_00000039;
  
  iVar6 = (int)CONCAT71(in_register_00000031,y);
  iVar7 = (int)CONCAT71(in_register_00000039,x);
  if (level->locations[iVar7][iVar6].typ == '\x17') {
    pcVar3 = in_rooms(level,x,y,0x12);
    rmno = *pcVar3;
    while (rmno != '\0') {
      pmVar4 = shop_keeper(level,rmno);
      if (((pmVar4 != (monst *)0x0) && ((char)pmVar4[0x1b].mintrinsics == x)) &&
         (*(char *)((long)&pmVar4[0x1b].mintrinsics + 1) == y)) {
        if (*pcVar3 == '\0') {
          return;
        }
        goto LAB_00240c26;
      }
      rmno = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    }
  }
  else {
LAB_00240c26:
    plVar2 = level;
    pdVar1 = level->damagelist;
    for (pdVar5 = pdVar1; pdVar5 != (damage *)0x0; pdVar5 = pdVar5->next) {
      if (((pdVar5->place).x == x) && ((pdVar5->place).y == y)) {
        pdVar5->cost = pdVar5->cost + cost;
        return;
      }
    }
    pdVar5 = (damage *)malloc(0x20);
    pdVar5->when = (ulong)moves;
    (pdVar5->place).x = x;
    (pdVar5->place).y = y;
    pdVar5->cost = cost;
    pdVar5->typ = plVar2->locations[iVar7][iVar6].typ;
    pdVar5->next = pdVar1;
    plVar2->damagelist = pdVar5;
    if ((viz_array[iVar6][iVar7] & 2U) != 0) {
      plVar2->locations[iVar7][iVar6].seenv = 0xff;
    }
  }
  return;
}

Assistant:

void add_damage(xchar x, xchar y, long cost)
{
	struct damage *tmp_dam;
	char *shops;

	if (IS_DOOR(level->locations[x][y].typ)) {
	    struct monst *mtmp;

	    /* Don't schedule for repair unless it's a real shop entrance */
	    for (shops = in_rooms(level, x, y, SHOPBASE); *shops; shops++)
		if ((mtmp = shop_keeper(level, *shops)) != 0 &&
			x == ESHK(mtmp)->shd.x && y == ESHK(mtmp)->shd.y)
		    break;
	    if (!*shops) return;
	}
	for (tmp_dam = level->damagelist; tmp_dam; tmp_dam = tmp_dam->next)
	    if (tmp_dam->place.x == x && tmp_dam->place.y == y) {
		tmp_dam->cost += cost;
		return;
	    }
	tmp_dam = malloc((unsigned)sizeof(struct damage));
	tmp_dam->when = moves;
	tmp_dam->place.x = x;
	tmp_dam->place.y = y;
	tmp_dam->cost = cost;
	tmp_dam->typ = level->locations[x][y].typ;
	tmp_dam->next = level->damagelist;
	level->damagelist = tmp_dam;
	/* If player saw damage, display as a wall forever */
	if (cansee(x, y))
	    level->locations[x][y].seenv = SVALL;
}